

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void envy_bios_print_bit_M(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_bit_entry *peVar1;
  int iVar2;
  uint offset;
  ulong uVar3;
  uint16_t addr;
  char *name;
  
  peVar1 = (bios->mem).bit;
  if ((mask >> 0xc & 1) != 0 && peVar1 != (envy_bios_bit_entry *)0x0) {
    fprintf((FILE *)out,"BIT table \'M\' at 0x%x, version %i\n",(ulong)peVar1->offset,
            (ulong)peVar1->version);
    offset = 1;
    while( true ) {
      peVar1 = (bios->mem).bit;
      if (peVar1->t_len <= offset) break;
      iVar2 = bios_u16(bios,peVar1->t_offset + offset,&addr);
      if (addr != 0 && iVar2 == 0) {
        uVar3 = (ulong)addr;
        name = "UNKNOWN";
        parse_at(bios,&bios->mem,-1,offset,&name);
        fprintf((FILE *)out,"0x%02x: 0x%x => %s TABLE\n",(ulong)offset,uVar3,name);
      }
      offset = offset + 2;
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void
envy_bios_print_bit_M (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem *mem = &bios->mem;
	const char *name;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!mem->bit || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "BIT table 'M' at 0x%x, version %i\n",
			mem->bit->offset, mem->bit->version);

	for (i = 1; i < mem->bit->t_len; i+=2) {
		ret = bios_u16(bios, mem->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, mem, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}

	fprintf(out, "\n");
}